

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void mpt_copy_fd(int pts,float *src,int lds,double *dest,int ldd)

{
  float fVar1;
  undefined1 auVar2 [16];
  long lVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  long lVar7;
  
  auVar2 = _DAT_0011f070;
  if (0 < pts) {
    if (ldd == 0) {
      *dest = (double)src[(pts + -1) * lds];
      return;
    }
    if (lds == 0) {
      fVar1 = *src;
      lVar3 = (ulong)(uint)pts - 1;
      auVar5._8_4_ = (int)lVar3;
      auVar5._0_8_ = lVar3;
      auVar5._12_4_ = (int)((ulong)lVar3 >> 0x20);
      lVar3 = 0;
      auVar5 = auVar5 ^ _DAT_0011f070;
      auVar6 = _DAT_0011f060;
      do {
        auVar8 = auVar6 ^ auVar2;
        if ((bool)(~(auVar8._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar8._0_4_ ||
                    auVar5._4_4_ < auVar8._4_4_) & 1)) {
          *(double *)((long)dest + lVar3) = (double)fVar1;
        }
        if ((auVar8._12_4_ != auVar5._12_4_ || auVar8._8_4_ <= auVar5._8_4_) &&
            auVar8._12_4_ <= auVar5._12_4_) {
          *(double *)((long)dest + lVar3 + 8) = (double)fVar1;
        }
        lVar7 = auVar6._8_8_;
        auVar6._0_8_ = auVar6._0_8_ + 2;
        auVar6._8_8_ = lVar7 + 2;
        lVar3 = lVar3 + 0x10;
      } while ((ulong)(pts + 1U >> 1) << 4 != lVar3);
    }
    else if (ldd == 1 && lds == 1) {
      uVar4 = 0;
      do {
        dest[uVar4] = (double)src[uVar4];
        uVar4 = uVar4 + 1;
      } while ((uint)pts != uVar4);
    }
    else {
      do {
        *dest = (double)*src;
        dest = dest + ldd;
        src = src + lds;
        pts = pts + -1;
      } while (pts != 0);
    }
  }
  return;
}

Assistant:

extern void MPT_COPY_FCN(int pts, const MPT_COPY_ST *src, int lds, MPT_COPY_DT *dest, int ldd)
{
	int i, j;
	
	if (pts <= 0) {
		return;
	}
	if (!ldd) {
		dest[0] = src[(pts - 1) * lds];
		return;
	}
	if (!lds) {
		for (i = 0; i < pts; i++) {
			dest[i] = src[0];
		}
		return;
	}
	if (lds == 1 && ldd == 1) {
		for (i = 0; i < pts; i++) {
			dest[i] = src[i];
		}
		return;
	}
	for (i = 0, j = 0; pts--; i += ldd, j += lds) {
		dest[i] = src[j];
	}
}